

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O0

void duckdb::MinMaxNOperation::
     Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,_duckdb::MinMaxFixedValue<float>,_duckdb::LessThan>
  *this;
  bool bVar1;
  ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,_duckdb::MinMaxFixedValue<float>,_duckdb::LessThan>
  **ppAVar2;
  idx_t iVar3;
  list_entry_t *plVar4;
  Vector *pVVar5;
  long lVar6;
  STORAGE_TYPE *pSVar7;
  Vector *pVVar8;
  undefined1 *puVar9;
  ulong in_RCX;
  long in_R8;
  idx_t slot;
  STORAGE_TYPE *heap;
  list_entry_t *list_entry;
  ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,_duckdb::MinMaxFixedValue<float>,_duckdb::LessThan>
  *state_1;
  idx_t state_idx_1;
  idx_t rid;
  idx_t i_1;
  idx_t current_offset;
  Vector *child_data;
  list_entry_t *list_entries;
  ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,_duckdb::MinMaxFixedValue<float>,_duckdb::LessThan>
  *state;
  idx_t state_idx;
  idx_t i;
  idx_t new_entries;
  idx_t old_len;
  ValidityMask *mask;
  ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,_duckdb::MinMaxFixedValue<float>,_duckdb::LessThan>
  **states;
  UnifiedVectorFormat state_format;
  Vector *in_stack_fffffffffffffe98;
  Vector *in_stack_fffffffffffffea0;
  long *in_stack_fffffffffffffea8;
  Vector *in_stack_fffffffffffffeb0;
  Vector *local_108;
  ulong local_d8;
  Vector *local_d0;
  ulong local_a8;
  UnifiedVectorFormat *in_stack_ffffffffffffff60;
  idx_t in_stack_ffffffffffffff68;
  Vector *in_stack_ffffffffffffff70;
  UnifiedVectorFormat local_70;
  long local_28;
  ulong local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffeb0);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  ppAVar2 = UnifiedVectorFormat::
            GetData<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>*>
                      (&local_70);
  FlatVector::Validity((Vector *)0x1bacf8b);
  local_d0 = (Vector *)ListVector::GetListSize(in_stack_fffffffffffffe98);
  for (local_a8 = 0; local_a8 < local_20; local_a8 = local_a8 + 1) {
    iVar3 = SelectionVector::get_index(local_70.sel,local_a8);
    BinaryAggregateHeap<float,_long,_duckdb::LessThan>::Size(&ppAVar2[iVar3]->heap);
  }
  ListVector::Reserve(in_stack_fffffffffffffea0,(idx_t)in_stack_fffffffffffffe98);
  plVar4 = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0x1bad0b2);
  pVVar5 = ListVector::GetEntry((Vector *)0x1bad0d3);
  for (local_d8 = 0; local_d8 < local_20; local_d8 = local_d8 + 1) {
    lVar6 = local_d8 + local_28;
    iVar3 = SelectionVector::get_index(local_70.sel,local_d8);
    this = ppAVar2[iVar3];
    if (((this->is_initialized & 1U) == 0) ||
       (bVar1 = BinaryAggregateHeap<float,_long,_duckdb::LessThan>::IsEmpty(&this->heap), bVar1)) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffea0,
                 (idx_t)in_stack_fffffffffffffe98);
    }
    else {
      plVar4[lVar6].offset = (uint64_t)local_d0;
      iVar3 = BinaryAggregateHeap<float,_long,_duckdb::LessThan>::Size(&this->heap);
      plVar4[lVar6].length = iVar3;
      pSVar7 = BinaryAggregateHeap<float,_long,_duckdb::LessThan>::SortAndGetHeap
                         ((BinaryAggregateHeap<float,_long,_duckdb::LessThan> *)
                          in_stack_fffffffffffffea0);
      local_108 = (Vector *)0x0;
      while (in_stack_fffffffffffffeb0 = local_108,
            pVVar8 = (Vector *)BinaryAggregateHeap<float,_long,_duckdb::LessThan>::Size(&this->heap)
            , in_stack_fffffffffffffeb0 < pVVar8) {
        puVar9 = &local_d0->field_0x1;
        in_stack_fffffffffffffe98 = pVVar5;
        in_stack_fffffffffffffea8 =
             BinaryAggregateHeap<float,_long,_duckdb::LessThan>::GetValue(pSVar7 + (long)local_108);
        MinMaxFixedValue<long>::Assign
                  (in_stack_fffffffffffffeb0,(idx_t)in_stack_fffffffffffffea8,
                   (TYPE_conflict *)local_d0);
        local_108 = (Vector *)&local_108->field_0x1;
        in_stack_fffffffffffffea0 = local_d0;
        local_d0 = (Vector *)puVar9;
      }
    }
  }
  ListVector::SetListSize(in_stack_fffffffffffffea0,(idx_t)in_stack_fffffffffffffe98);
  Vector::Verify(in_stack_fffffffffffffeb0,(idx_t)in_stack_fffffffffffffea8);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffea0);
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}